

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
FindAllExtensionNumbers
          (DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *containing_type,
          vector<int,_std::allocator<int>_> *output)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  iterator __position;
  bool bVar3;
  int iVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  
  local_58.first._M_dataplus._M_p = (pointer)&local_58.first.field_2;
  pcVar2 = (containing_type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + containing_type->_M_string_length);
  local_58.second = 0;
  p_Var6 = (this->by_extension_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->by_extension_)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var1->_M_header;
  if (p_Var6 != (_Base_ptr)0x0) {
    do {
      bVar3 = std::
              less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              ::operator()((less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                            *)&this->by_extension_,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                            *)(p_Var6 + 1),&local_58);
      if (!bVar3) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar3];
    } while (p_Var6 != (_Base_ptr)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != &local_58.first.field_2) {
    operator_delete(local_58.first._M_dataplus._M_p);
  }
  if (((_Rb_tree_header *)p_Var5 == p_Var1) ||
     (p_Var6 = p_Var5[1]._M_parent, p_Var6 != (_Base_ptr)containing_type->_M_string_length)) {
    bVar3 = false;
  }
  else {
    bVar7 = false;
    do {
      if ((p_Var6 != (_Base_ptr)0x0) &&
         (iVar4 = bcmp(*(void **)(p_Var5 + 1),(containing_type->_M_dataplus)._M_p,(size_t)p_Var6),
         iVar4 != 0)) {
        return bVar7;
      }
      __position._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)output,__position,(int *)(p_Var5 + 2));
      }
      else {
        *__position._M_current = p_Var5[2]._M_color;
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      if ((_Rb_tree_header *)p_Var5 == p_Var1) {
        return true;
      }
      p_Var6 = p_Var5[1]._M_parent;
      bVar7 = true;
      bVar3 = true;
    } while (p_Var6 == (_Base_ptr)containing_type->_M_string_length);
  }
  return bVar3;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::FindAllExtensionNumbers(
    const std::string& containing_type, std::vector<int>* output) {
  typename std::map<std::pair<std::string, int>, Value>::const_iterator it =
      by_extension_.lower_bound(std::make_pair(containing_type, 0));
  bool success = false;

  for (; it != by_extension_.end() && it->first.first == containing_type;
       ++it) {
    output->push_back(it->first.second);
    success = true;
  }

  return success;
}